

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
emplaceRealloc<slang::ast::StreamingConcatenationExpression::StreamExpression>
          (SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression> *this,
          pointer pos,StreamExpression *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Expression *pEVar3;
  pointer pSVar4;
  pointer pSVar5;
  size_type sVar6;
  pointer pSVar7;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pSVar4 = (pointer)detail::allocArray(capacity,0x18);
  *(_Optional_payload_base<unsigned_int> *)((long)pSVar4 + lVar8 + 0x10) =
       (args->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>;
  pEVar3 = args->withExpr;
  *(undefined8 *)((long)pSVar4 + lVar8) = (args->operand).ptr;
  ((undefined8 *)((long)pSVar4 + lVar8))[1] = pEVar3;
  pSVar5 = this->data_;
  sVar6 = this->len;
  if (pSVar5 + sVar6 == pos) {
    pSVar7 = pSVar4;
    if (sVar6 != 0) {
      do {
        (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (pSVar5->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        pEVar3 = pSVar5->withExpr;
        (pSVar7->operand).ptr = (pSVar5->operand).ptr;
        pSVar7->withExpr = pEVar3;
        pSVar5 = pSVar5 + 1;
        pSVar7 = pSVar7 + 1;
      } while (pSVar5 != pos);
    }
  }
  else {
    pSVar7 = pSVar4;
    if (pSVar5 != pos) {
      do {
        (pSVar7->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (pSVar5->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        pEVar3 = pSVar5->withExpr;
        (pSVar7->operand).ptr = (pSVar5->operand).ptr;
        pSVar7->withExpr = pEVar3;
        pSVar5 = pSVar5 + 1;
        pSVar7 = pSVar7 + 1;
      } while (pSVar5 != pos);
      pSVar5 = this->data_;
      sVar6 = this->len;
    }
    if (pSVar5 + sVar6 != pos) {
      puVar2 = (undefined8 *)((long)pSVar4 + lVar8);
      do {
        *(_Optional_payload_base<unsigned_int> *)(puVar2 + 5) =
             (pos->constantWithWidth).super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>;
        pEVar3 = pos->withExpr;
        puVar2[3] = (pos->operand).ptr;
        puVar2[4] = pEVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 3;
      } while (pos != pSVar5 + sVar6);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pSVar4;
  return (pointer)((long)pSVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}